

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
::increment_slow(btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
                 *this)

{
  int iVar1;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar6;
  char *__function;
  size_type i;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>
  save;
  int iStack_10;
  
  pbVar6 = this->node;
  if (((ulong)pbVar6 & 7) == 0) {
    iVar1 = this->position;
    if (pbVar6[0xb] ==
        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar6[10] <= iVar1) {
        __assert_fail("position < node->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x97d,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, phmap::test_internal::MovableOnlyInstance &, phmap::test_internal::MovableOnlyInstance *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, Reference = phmap::test_internal::MovableOnlyInstance &, Pointer = phmap::test_internal::MovableOnlyInstance *]"
                     );
      }
      i = (long)iVar1 + 1;
      while( true ) {
        pbVar6 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 ::child(pbVar6,i);
        this->node = pbVar6;
        if (((ulong)pbVar6 & 7) != 0) break;
        if (pbVar6[0xb] !=
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
             )0x0) {
          this->position = 0;
          return;
        }
        i = 0;
      }
    }
    else {
      if (iVar1 < (int)(uint)(byte)pbVar6[10]) {
        __assert_fail("position >= node->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x972,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, phmap::test_internal::MovableOnlyInstance &, phmap::test_internal::MovableOnlyInstance *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, Reference = phmap::test_internal::MovableOnlyInstance &, Pointer = phmap::test_internal::MovableOnlyInstance *]"
                     );
      }
      pbVar2 = this->node;
      uVar3 = *(undefined8 *)&this->position;
      pbVar6 = this->node;
      while (((ulong)pbVar6 & 7) == 0) {
        if ((this->position != (uint)(byte)pbVar6[10]) ||
           (bVar4 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                    ::is_root(pbVar6), bVar4)) {
          if (((ulong)this->node & 7) == 0) {
            if (this->position == (uint)(byte)this->node[10]) {
              iStack_10 = (int)uVar3;
              this->position = iStack_10;
              this->node = pbVar2;
            }
            return;
          }
          break;
        }
        pbVar6 = this->node;
        if (((ulong)pbVar6 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_00298ff0;
        }
        pbVar5 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 ::child(*(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                           **)pbVar6,(ulong)(byte)pbVar6[8]);
        pbVar6 = this->node;
        if (pbVar5 != pbVar6) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x975,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, phmap::test_internal::MovableOnlyInstance &, phmap::test_internal::MovableOnlyInstance *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>, Reference = phmap::test_internal::MovableOnlyInstance &, Pointer = phmap::test_internal::MovableOnlyInstance *]"
                       );
        }
        if (((ulong)pbVar6 & 7) != 0) break;
        this->position = (uint)(byte)pbVar6[8];
        pbVar6 = *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                   **)pbVar6;
        this->node = pbVar6;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_00298ff0:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
        if (node->leaf()) {
            assert(position >= node->count());
            btree_iterator save(*this);
            while (position == node->count() && !node->is_root()) {
                assert(node->parent()->child(node->position()) == node);
                position = node->position();
                node = node->parent();
            }
            if (position == node->count()) {
                *this = save;
            }
        } else {
            assert(position < node->count());
            node = node->child(position + 1);
            while (!node->leaf()) {
                node = node->child(0);
            }
            position = 0;
        }
    }